

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O3

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DuckTableEntry::AddColumn(DuckTableEntry *this,ClientContext *context,AddColumnInfo *info)

{
  __node_base *__ht;
  SchemaCatalogEntry *pSVar1;
  __node_base_ptr p_Var2;
  Catalog *catalog;
  __node_base this_00;
  bool bVar3;
  CreateTableInfo *this_01;
  pointer pCVar4;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_02;
  ColumnDefinition *this_03;
  pointer pCVar5;
  Binder *pBVar6;
  LogicalType *type;
  type __args_1;
  reference this_04;
  type __args_3;
  type info_00;
  DuckTableEntry *this_05;
  long in_RCX;
  __node_base_ptr this_06;
  ulong uVar7;
  ColumnListIterator CVar8;
  templated_unique_single_t create_info;
  shared_ptr<duckdb::DataTable,_true> new_storage;
  shared_ptr<duckdb::Binder,_true> binder;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  bound_defaults;
  ColumnDefinition col;
  string col_name;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> local_360;
  undefined1 local_351;
  undefined1 local_350 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_340;
  shared_ptr<duckdb::DataTable,_true> local_338;
  __node_base local_328;
  ClientContext *local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  undefined1 local_308 [24];
  __node_base _Stack_2f0;
  size_type local_2e8;
  __node_base local_2e0;
  undefined1 local_2d8 [8];
  pointer local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  LogicalType local_2b8;
  DummyBinding *local_2a0;
  undefined8 uStack_28f;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_280;
  Value local_278;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  a_Stack_238 [56];
  string local_200;
  undefined1 local_1e0 [88];
  __node_base local_188;
  Value local_180;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  a_Stack_140 [56];
  undefined1 local_108 [32];
  LogicalType local_e8 [2];
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_b0;
  Value local_a8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68 [56];
  
  local_328._M_nxt = (_Hash_node_base *)(in_RCX + 0x78);
  local_320 = (ClientContext *)info;
  ColumnDefinition::GetName_abi_cxx11_(&local_200,(ColumnDefinition *)local_328._M_nxt);
  if (*(char *)(in_RCX + 0x150) == '\x01') {
    bVar3 = ColumnList::ColumnExists
                      ((ColumnList *)&(context->config).asof_loop_join_threshold,&local_200);
    if (bVar3) {
      (this->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.super_CatalogEntry.
      _vptr_CatalogEntry = (_func_int **)0x0;
      goto LAB_011d82f1;
    }
  }
  pSVar1 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
  local_2e0._M_nxt = (_Hash_node_base *)this;
  this_01 = (CreateTableInfo *)operator_new(0x1d8);
  local_2d8 = (undefined1  [8])&local_2c8;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_2d8,*(long *)&context->interrupted,
             (long)&(((context->registered_state).
                      super_unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
                      .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl)
                    ->lock).super___mutex_base._M_mutex + *(long *)&context->interrupted);
  CreateTableInfo::CreateTableInfo(this_01,pSVar1,(string *)local_2d8);
  local_360._M_head_impl = this_01;
  if (local_2d8 != (undefined1  [8])&local_2c8) {
    operator_delete((void *)local_2d8);
  }
  bVar3 = *(bool *)((long)&(context->config).home_directory._M_string_length + 1);
  pCVar4 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_360);
  (pCVar4->super_CreateInfo).temporary = bVar3;
  pCVar4 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_360);
  Value::operator=(&(pCVar4->super_CreateInfo).comment,
                   (Value *)((long)&(context->config).home_directory.field_2 + 8));
  pCVar4 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_360);
  __ht = &(context->config).profiler_settings._M_h._M_before_begin;
  this_02 = &(pCVar4->super_CreateInfo).tags;
  if ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)__ht != this_02) {
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this_02,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)__ht);
  }
  CVar8 = ColumnList::Logical((ColumnList *)&(context->config).asof_loop_join_threshold);
  local_340 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CVar8.list;
  if (((undefined1  [16])CVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_2c8._8_8_ =
         ((long)(*(long *)((long)local_340 + 8) - local_340->_M_allocated_capacity) >> 3) *
         -0x7b425ed097b425ed;
    uVar7 = ((long)(*(long *)((long)local_340 + 8) - local_340->_M_allocated_capacity) >> 3) *
            -0x7b425ed097b425ed;
  }
  else {
    uVar7 = *(long *)(local_340->_M_local_buf + 0x58) - *(long *)(local_340->_M_local_buf + 0x50) >>
            3;
    local_2c8._8_8_ = uVar7;
  }
  local_2c8._M_allocated_capacity = 0;
  local_2d0 = (pointer)CONCAT71(local_2d0._1_7_,CVar8.physical);
  local_2d8 = (undefined1  [8])local_340;
  while (((local_2c8._M_allocated_capacity != uVar7 || (local_2c8._8_8_ != uVar7)) ||
         (local_2d8 != (undefined1  [8])local_340))) {
    this_03 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                        ((ColumnLogicalIteratorInternal *)local_2d8);
    pCVar4 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_360);
    ColumnDefinition::Copy((ColumnDefinition *)local_108,this_03);
    ColumnList::AddColumn(&pCVar4->columns,(ColumnDefinition *)local_108);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(local_68);
    Value::~Value(&local_a8);
    if (local_b0._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
    local_b0._M_head_impl = (ParsedExpression *)0x0;
    LogicalType::~LogicalType(local_e8);
    if ((_Hash_node_base *)local_108._0_8_ != (_Hash_node_base *)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_);
    }
    local_2c8._M_allocated_capacity = local_2c8._M_allocated_capacity + 1;
  }
  this_06 = (__node_base_ptr)(context->config).set_variables._M_h._M_rehash_policy._M_next_resize;
  p_Var2 = (context->config).set_variables._M_h._M_single_bucket;
  if (this_06 != p_Var2) {
    do {
      pCVar4 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
               ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                             *)&local_360);
      pCVar5 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
               operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                           *)this_06);
      (*pCVar5->_vptr_Constraint[3])
                ((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
                 local_2d8,pCVar5);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
                  *)&pCVar4->constraints,
                 (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
                 local_2d8);
      if (local_2d8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_2d8 + 8))();
      }
      this_06 = this_06 + 1;
    } while (this_06 != p_Var2);
  }
  Binder::CreateBinder
            ((Binder *)local_308,local_320,(optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER);
  pBVar6 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)local_308);
  this_00._M_nxt = local_328._M_nxt;
  type = ColumnDefinition::TypeMutable((ColumnDefinition *)local_328._M_nxt);
  Binder::BindLogicalType
            (pBVar6,type,(Catalog *)(context->config).max_expression_depth,
             (string *)(*(long *)&(context->config).query_verification_enabled + 0x20));
  ColumnDefinition::SetOid
            ((ColumnDefinition *)this_00._M_nxt,
             ((long)((context->config).streaming_buffer_size -
                    (context->config).asof_loop_join_threshold) >> 3) * -0x7b425ed097b425ed);
  ColumnDefinition::SetStorageOid
            ((ColumnDefinition *)this_00._M_nxt,
             (long)((long)(context->config).set_variables._M_h._M_before_begin._M_nxt -
                   (context->config).set_variables._M_h._M_bucket_count) >> 3);
  ColumnDefinition::Copy((ColumnDefinition *)local_2d8,(ColumnDefinition *)this_00._M_nxt);
  pCVar4 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_360);
  local_1e0._0_8_ = local_1e0 + 0x10;
  if (local_2d8 == (undefined1  [8])&local_2c8) {
    local_1e0._24_8_ = local_2c8._8_8_;
  }
  else {
    local_1e0._0_8_ = local_2d8;
  }
  local_1e0._16_8_ = local_2c8._M_allocated_capacity;
  local_1e0._8_8_ = local_2d0;
  local_2d0 = (pointer)0x0;
  local_2c8._M_allocated_capacity = local_2c8._M_allocated_capacity & 0xffffffffffffff00;
  local_2d8 = (undefined1  [8])&local_2c8;
  LogicalType::LogicalType((LogicalType *)(local_1e0 + 0x20),&local_2b8);
  local_1e0._73_8_ = uStack_28f;
  local_1e0._56_8_ = local_2a0;
  local_188._M_nxt = (_Hash_node_base *)local_280._M_head_impl;
  local_280._M_head_impl = (ParsedExpression *)0x0;
  Value::Value(&local_180,&local_278);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(a_Stack_140,a_Stack_238,a_Stack_238);
  ColumnList::AddColumn(&pCVar4->columns,(ColumnDefinition *)local_1e0);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(a_Stack_140);
  Value::~Value(&local_180);
  if ((BoundParameterMap *)local_188._M_nxt != (BoundParameterMap *)0x0) {
    (*(code *)(local_188._M_nxt)->_M_nxt[1]._M_nxt)();
  }
  local_188._M_nxt = (_Hash_node_base *)0x0;
  LogicalType::~LogicalType((LogicalType *)(local_1e0 + 0x20));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_1e0 + 0x10)) {
    operator_delete((void *)local_1e0._0_8_);
  }
  local_308._16_8_ = (ClientContext *)0x0;
  _Stack_2f0._M_nxt = (_Hash_node_base *)0x0;
  local_2e8 = 0;
  pBVar6 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)local_308);
  local_350._8_8_ = local_360._M_head_impl;
  local_360._M_head_impl = (CreateTableInfo *)0x0;
  Binder::BindCreateTableInfo
            ((Binder *)local_350,
             (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)pBVar6
             ,(SchemaCatalogEntry *)(local_350 + 8),
             *(vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               **)&(context->config).query_verification_enabled);
  if ((CreateTableInfo *)local_350._8_8_ != (CreateTableInfo *)0x0) {
    (*(((CreateInfo *)local_350._8_8_)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  local_350._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __args_1 = shared_ptr<duckdb::DataTable,_true>::operator*
                       ((shared_ptr<duckdb::DataTable,_true> *)
                        &(context->config).user_variables._M_h._M_bucket_count);
  this_04 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::back((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)(local_308 + 0x10));
  __args_3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(this_04);
  local_338.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::DataTable,std::allocator<duckdb::DataTable>,duckdb::ClientContext&,duckdb::DataTable&,duckdb::ColumnDefinition&,duckdb::Expression&>
            (&local_338.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(DataTable **)&local_338,(allocator<duckdb::DataTable> *)&local_351,
             local_320,__args_1,(ColumnDefinition *)local_328._M_nxt,__args_3);
  shared_ptr<duckdb::DataTable,_true>::shared_ptr
            ((shared_ptr<duckdb::DataTable,_true> *)&local_318,&local_338.internal);
  if (local_338.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_338.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  catalog = (Catalog *)(context->config).max_expression_depth;
  pSVar1 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
  info_00 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
            ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                         *)local_350);
  this_05 = (DuckTableEntry *)operator_new(0x298);
  local_338.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_318._M_allocated_capacity;
  local_338.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_318._8_8_ + 8) = *(_Atomic_word *)(local_318._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_318._8_8_ + 8) = *(_Atomic_word *)(local_318._8_8_ + 8) + 1;
    }
  }
  DuckTableEntry(this_05,catalog,pSVar1,info_00,&local_338);
  if (local_338.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_338.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  this = (DuckTableEntry *)local_2e0._M_nxt;
  (local_2e0._M_nxt)->_M_nxt = (_Hash_node_base *)this_05;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._8_8_);
  }
  if ((_Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
       )local_350._0_8_ != (BoundCreateTableInfo *)0x0) {
    ::std::default_delete<duckdb::BoundCreateTableInfo>::operator()
              ((default_delete<duckdb::BoundCreateTableInfo> *)local_350,
               (BoundCreateTableInfo *)local_350._0_8_);
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)(local_308 + 0x10));
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(a_Stack_238);
  Value::~Value(&local_278);
  if (local_280._M_head_impl != (ParsedExpression *)0x0) {
    (*(code *)((__node_base_ptr)
              ((local_280._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)[1]._M_nxt)();
  }
  local_280._M_head_impl = (ParsedExpression *)0x0;
  LogicalType::~LogicalType(&local_2b8);
  if (local_2d8 != (undefined1  [8])&local_2c8) {
    operator_delete((void *)local_2d8);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_);
  }
  if (local_360._M_head_impl != (CreateTableInfo *)0x0) {
    (*((local_360._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
  }
LAB_011d82f1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (__uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)this;
}

Assistant:

unique_ptr<CatalogEntry> DuckTableEntry::AddColumn(ClientContext &context, AddColumnInfo &info) {
	auto col_name = info.new_column.GetName();

	// We're checking for the opposite condition (ADD COLUMN IF _NOT_ EXISTS ...).
	if (info.if_column_not_exists && ColumnExists(col_name)) {
		return nullptr;
	}

	auto create_info = make_uniq<CreateTableInfo>(schema, name);
	create_info->temporary = temporary;
	create_info->comment = comment;
	create_info->tags = tags;

	for (auto &col : columns.Logical()) {
		create_info->columns.AddColumn(col.Copy());
	}
	for (auto &constraint : constraints) {
		create_info->constraints.push_back(constraint->Copy());
	}
	auto binder = Binder::CreateBinder(context);
	binder->BindLogicalType(info.new_column.TypeMutable(), &catalog, schema.name);
	info.new_column.SetOid(columns.LogicalColumnCount());
	info.new_column.SetStorageOid(columns.PhysicalColumnCount());
	auto col = info.new_column.Copy();

	create_info->columns.AddColumn(std::move(col));

	vector<unique_ptr<Expression>> bound_defaults;
	auto bound_create_info = binder->BindCreateTableInfo(std::move(create_info), schema, bound_defaults);
	auto new_storage = make_shared_ptr<DataTable>(context, *storage, info.new_column, *bound_defaults.back());
	return make_uniq<DuckTableEntry>(catalog, schema, *bound_create_info, new_storage);
}